

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O2

mcpl_file_t mcpl_actual_open_file(char *filename,int *repair_status)

{
  int iVar1;
  int iVar2;
  mcpl_fileinternal_t *f;
  char *__s1;
  FILE *__stream;
  ulong uVar3;
  gzFile pgVar4;
  size_t sVar5;
  uint64_t uVar6;
  char **ppcVar7;
  uint64_t uVar8;
  uint32_t *puVar9;
  ulong uVar10;
  mcpl_particle_t *pmVar11;
  long lVar12;
  long lVar13;
  long lStack_90;
  uchar start [8];
  uint64_t numpart;
  uint32_t arr [8];
  char testbuf [4];
  
  iVar2 = *repair_status;
  *repair_status = 0;
  if (filename == (char *)0x0) {
    mcpl_error("mcpl_open_file called with null string");
  }
  f = (mcpl_fileinternal_t *)mcpl_internal_calloc(1,0x100);
  f->file = (FILE *)0x0;
  f->filegz = (gzFile)0x0;
  __s1 = strrchr(filename,0x2e);
  if ((__s1 == (char *)0x0) || (iVar1 = strcmp(__s1,".gz"), iVar1 != 0)) {
    __stream = (FILE *)mcpl_internal_fopen(filename,"rb");
    f->file = (FILE *)__stream;
    if (__stream == (FILE *)0x0) goto LAB_00103e7a;
    pgVar4 = f->filegz;
    if (pgVar4 != (gzFile)0x0) goto LAB_00103a15;
    uVar3 = fread(start,1,8,__stream);
  }
  else {
    pgVar4 = mcpl_gzopen(filename,"rb");
    f->filegz = pgVar4;
    if (pgVar4 == (gzFile)0x0) {
LAB_00103e7a:
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
LAB_00103a15:
    iVar1 = gzread(pgVar4,start,8);
    uVar3 = (ulong)iVar1;
  }
  if (3 < uVar3) {
    if (start._0_4_ != 0x4c50434d) {
      mcpl_error("File is not an MCPL file!");
    }
    if (uVar3 == 8) {
      iVar1 = (uint)start[5] * 10 + (uint)start[4] * 100;
      f->format_version = ((uint)start[6] + iVar1) - 0x14d0;
      if ((iVar1 + (uint)start[6] & 0xfffffffe) != 0x14d2) {
        mcpl_error("File is in an unsupported MCPL version!");
      }
      arr[0] = 0x1234567;
      f->is_little_endian = 1;
      if (start[7] != 'L') {
        if (start[7] != 'B') {
          mcpl_error("Unexpected value in endianness field!");
        }
        mcpl_error(
                  "Endian-ness of current platform is different than the one used to write the file."
                  );
      }
      if (f->filegz == (gzFile)0x0) {
        sVar5 = fread(&numpart,1,8,(FILE *)f->file);
      }
      else {
        iVar1 = gzread(f->filegz,&numpart,8);
        sVar5 = (size_t)iVar1;
      }
      if (sVar5 == 8) {
        f->nparticles = numpart;
        if (f->filegz == (gzFile)0x0) {
          sVar5 = fread(arr,1,0x20,(FILE *)f->file);
        }
        else {
          iVar1 = gzread(f->filegz,arr,0x20);
          sVar5 = (size_t)iVar1;
        }
        if (sVar5 == 0x20) {
          f->ncomments = arr[0];
          f->nblobs = arr[1];
          f->opt_userflags = arr[2];
          f->opt_polarisation = arr[3];
          f->opt_singleprec = arr[4];
          f->opt_universalpdgcode = arr[5];
          f->particle_size = arr[6];
          if (0x60 < arr[6]) {
            mcpl_error("unexpected particle size");
          }
          if (arr[7] == 0) {
            lStack_90 = 0x30;
          }
          else {
            if (f->filegz == (gzFile)0x0) {
              sVar5 = fread(&f->opt_universalweight,1,8,(FILE *)f->file);
            }
            else {
              iVar1 = gzread(f->filegz,&f->opt_universalweight,8);
              sVar5 = (size_t)iVar1;
            }
            if (sVar5 != 8) goto LAB_00103e45;
            arr[4] = f->opt_singleprec;
            arr[2] = f->opt_userflags;
            arr[3] = f->opt_polarisation;
            arr[5] = f->opt_universalpdgcode;
            lStack_90 = 0x38;
          }
          f->opt_signature =
               arr[2] * 0x10 +
               arr[4] + arr[3] * 2 + (uint)(arr[5] != 0) * 4 +
               (-(uint)(f->opt_universalweight != 0.0) & 1) * 8;
          uVar6 = mcpl_read_string(f,&f->hdr_srcprogname,
                                   "Errors encountered while attempting to read header");
          if ((ulong)f->ncomments == 0) {
            ppcVar7 = (char **)0x0;
          }
          else {
            ppcVar7 = (char **)mcpl_internal_calloc((ulong)f->ncomments,8);
          }
          uVar6 = uVar6 + lStack_90;
          f->comments = ppcVar7;
          lVar13 = 0;
          for (uVar3 = 0; uVar3 < f->ncomments; uVar3 = uVar3 + 1) {
            uVar8 = mcpl_read_string(f,(char **)((long)f->comments + lVar13),
                                     "Errors encountered while attempting to read header");
            uVar6 = uVar6 + uVar8;
            lVar13 = lVar13 + 8;
          }
          f->blobs = (char **)0x0;
          f->blobkeys = (char **)0x0;
          f->bloblengths = (uint32_t *)0x0;
          if ((ulong)f->nblobs != 0) {
            ppcVar7 = (char **)mcpl_internal_calloc((ulong)f->nblobs,8);
            f->blobs = ppcVar7;
            ppcVar7 = (char **)mcpl_internal_calloc((ulong)f->nblobs,8);
            f->blobkeys = ppcVar7;
            puVar9 = (uint32_t *)mcpl_internal_calloc((ulong)f->nblobs,4);
            f->bloblengths = puVar9;
            lVar13 = 0;
            for (uVar3 = 0; uVar10 = (ulong)f->nblobs, uVar3 < uVar10; uVar3 = uVar3 + 1) {
              uVar8 = mcpl_read_string(f,(char **)((long)f->blobkeys + lVar13),
                                       "Errors encountered while attempting to read header");
              uVar6 = uVar6 + uVar8;
              lVar13 = lVar13 + 8;
            }
            lVar12 = 0;
            lVar13 = 0;
            for (uVar3 = 0; uVar3 < uVar10; uVar3 = uVar3 + 1) {
              uVar8 = mcpl_read_buffer(f,(uint *)((long)f->bloblengths + lVar13),
                                       (char **)((long)f->blobs + lVar12),
                                       "Errors encountered while attempting to read header");
              uVar6 = uVar6 + uVar8;
              uVar10 = (ulong)f->nblobs;
              lVar13 = lVar13 + 4;
              lVar12 = lVar12 + 8;
            }
          }
          pmVar11 = (mcpl_particle_t *)mcpl_internal_calloc(1,0x68);
          f->particle = pmVar11;
          f->current_particle_idx = 0;
          f->first_particle_pos = uVar6;
          if (iVar2 != 0 || f->nparticles == 0) {
            pgVar4 = f->filegz;
            if (pgVar4 == (gzFile)0x0) {
              if (((FILE *)f->file != (FILE *)0x0) &&
                 (iVar1 = fseek((FILE *)f->file,0,2), iVar1 == 0)) {
                lVar13 = ftell((FILE *)f->file);
                uVar3 = lVar13 - f->first_particle_pos;
                if (uVar3 != 0 && (long)f->first_particle_pos <= lVar13) {
                  uVar3 = uVar3 / f->particle_size;
                  uVar10 = f->nparticles;
                  if (uVar10 != uVar3) {
                    if ((uVar10 != 0) && (uVar10 < uVar3)) {
                      mcpl_error("Input file has invalid combination of meta-data & filesize.");
                    }
                    if (iVar2 == 0) {
                      if (uVar10 != 0) {
                        mcpl_error("unexpected nparticles value");
                      }
                      printf("MCPL WARNING: Input file appears to not have been closed properly. Recovered %lu particles.\n"
                             ,uVar3);
                    }
                    else {
                      *repair_status = 3;
                    }
                    f->nparticles = uVar3;
                  }
                }
              }
              fseek((FILE *)f->file,f->first_particle_pos,0);
            }
            else {
              if (f->nparticles == 0) {
                iVar1 = gzread(pgVar4,testbuf,4);
                if (iVar1 != 0) {
                  if (iVar2 == 0) {
                    mcpl_error(
                              "Input file appears to not have been closed properly and data recovery is disabled for gzipped files."
                              );
                  }
                  *repair_status = 1;
                }
                pgVar4 = f->filegz;
                uVar6 = f->first_particle_pos;
              }
              else {
                if (iVar2 == 0) {
                  mcpl_error("logic error (!caller_is_mcpl_repair)");
                }
                *repair_status = 2;
              }
              iVar2 = mcpl_gzseek(pgVar4,uVar6);
              if (iVar2 == 0) {
                mcpl_error("Unexpected issue skipping to start of empty gzipped file");
              }
            }
          }
          return (mcpl_file_t)f;
        }
      }
LAB_00103e45:
      mcpl_error("Errors encountered while attempting to read header");
    }
  }
  mcpl_error("Error while reading first bytes of file!");
}

Assistant:

MCPL_LOCAL mcpl_file_t mcpl_actual_open_file(const char * filename, int * repair_status)
{
  int caller_is_mcpl_repair = *repair_status;
  *repair_status = 0;//file not broken

  if (!filename)
    mcpl_error("mcpl_open_file called with null string");

  mcpl_platform_compatibility_check();

  mcpl_file_t out;
  out.internal = NULL;

  mcpl_fileinternal_t * f
    = (mcpl_fileinternal_t*)mcpl_internal_calloc(1,sizeof(mcpl_fileinternal_t));

  //open file (with gzopen if filename ends with .gz):
  f->file = NULL;
  f->filegz = NULL;
  const char * lastdot = strrchr(filename, '.');
  if (lastdot && strcmp(lastdot, ".gz") == 0) {
    f->filegz = mcpl_gzopen( filename, "rb" );
    if (!f->filegz) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  } else {
    f->file = mcpl_internal_fopen(filename,"rb");
    if (!f->file) {
      mcpl_internal_cleanup_file(f);
      mcpl_error("Unable to open file!");
    }
  }

  //First read and check magic word, format version and endianness.
  unsigned char start[8];// = {'M','C','P','L','0','0','0','L'};
  size_t nb;
  if (f->filegz)
    nb = gzread(f->filegz, start, sizeof(start));
  else
    nb = fread(start, 1, sizeof(start), f->file);
  if (nb>=4&&(start[0]!='M'||start[1]!='C'||start[2]!='P'||start[3]!='L'))
    mcpl_error("File is not an MCPL file!");
  if (nb!=sizeof(start))
    mcpl_error("Error while reading first bytes of file!");
  f->format_version = (start[4]-'0')*100 + (start[5]-'0')*10 + (start[6]-'0');
  if (f->format_version!=2&&f->format_version!=3)
    mcpl_error("File is in an unsupported MCPL version!");
  f->is_little_endian = mcpl_platform_is_little_endian();
  if (start[7]!=(f->is_little_endian?'L':'B')) {
    if (start[7]=='L'||start[7]=='B')
      mcpl_error("Endian-ness of current platform is different than the one used to write the file.");
    else
      mcpl_error("Unexpected value in endianness field!");
  }
  int64_t current_pos = sizeof(start);

  //proceed reading header, knowing we have a consistent version and endian-ness.
  const char * errmsg = "Errors encountered while attempting to read header";

  uint64_t numpart;
  if (f->filegz)
    nb = gzread(f->filegz, &numpart, sizeof(numpart));
  else
    nb = fread(&numpart, 1, sizeof(numpart), f->file);
  if (nb!=sizeof(numpart))
    mcpl_error(errmsg);
  current_pos += nb;
  f->nparticles = numpart;

  uint32_t arr[8];
  MCPL_STATIC_ASSERT(sizeof(arr)==32);
  if (f->filegz)
    nb = gzread(f->filegz, arr, sizeof(arr));
  else
    nb=fread(arr, 1, sizeof(arr), f->file);
  if (nb!=sizeof(arr))
    mcpl_error(errmsg);
  current_pos += nb;

  f->ncomments = arr[0];
  f->nblobs = arr[1];
  f->opt_userflags = arr[2];
  f->opt_polarisation = arr[3];
  f->opt_singleprec = arr[4];
  f->opt_universalpdgcode = (int32_t)arr[5];
  f->particle_size = arr[6];//We could check consistency here with the calculated value.
  if ( ! (f->particle_size<=MCPLIMP_MAX_PARTICLE_SIZE) )
    mcpl_error("unexpected particle size");

  if (arr[7]) {
    //file has universal weight
    if (f->filegz)
      nb = gzread(f->filegz, (void*)&(f->opt_universalweight), sizeof(f->opt_universalweight));
    else
      nb=fread((void*)&(f->opt_universalweight), 1, sizeof(f->opt_universalweight), f->file);
    if (nb!=sizeof(f->opt_universalweight))
      mcpl_error(errmsg);
    current_pos += nb;
  }

  f->opt_signature = 0
    + 1 * f->opt_singleprec
    + 2 * f->opt_polarisation
    + 4 * (f->opt_universalpdgcode?1:0)
    + 8 * (f->opt_universalweight?1:0)
    + 16 * f->opt_userflags;

  //Then some strings:
  current_pos += mcpl_read_string(f,&f->hdr_srcprogname,errmsg);
  f->comments = ( f->ncomments
                  ? (char **)mcpl_internal_calloc(f->ncomments,sizeof(char*))
                  : NULL );
  uint32_t i;
  for (i = 0; i < f->ncomments; ++i)
    current_pos += mcpl_read_string(f,&(f->comments[i]),errmsg);

  f->blobkeys = NULL;
  f->bloblengths = 0;
  f->blobs = NULL;
  if (f->nblobs) {
    f->blobs = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->blobkeys = (char **)mcpl_internal_calloc(f->nblobs,sizeof(char*));
    f->bloblengths = (uint32_t *)mcpl_internal_calloc(f->nblobs,sizeof(uint32_t));
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_string(f,&(f->blobkeys[i]),errmsg);
    for (i =0; i < f->nblobs; ++i)
      current_pos += mcpl_read_buffer(f, &(f->bloblengths[i]), &(f->blobs[i]), errmsg);
  }
  f->particle = (mcpl_particle_t*)mcpl_internal_calloc(1,sizeof(mcpl_particle_t));

  //At first event now:
  f->current_particle_idx = 0;
  f->first_particle_pos = current_pos;

  if ( f->nparticles==0 || caller_is_mcpl_repair ) {
    //TODO: Perhaps the placeholder nparticles should be UINT64_MAX instead of
    //0, so we know that nparticles=0 is a properly closed file.

    //Although empty files are permitted, it is possible that the file was never
    //closed properly (maybe the writing program ended prematurely). Let us
    //check to possibly recover usage of the file. If caller is mcpl_repair, we
    //always check since the file might have been truncated after it was first
    //closed properly.
    if (f->filegz) {
      //SEEK_END is not supported by zlib, and there is no reliable way to get
      //the input size. Thus, all we can do is to uncompress the whole thing,
      //which we won't since it might stall operations for a long time. But we
      //can at least try to check whether the file is indeed empty or not, and
      //give an error in the latter case:
      if (f->nparticles==0) {
        char testbuf[4];
        nb = gzread(f->filegz, testbuf, sizeof(testbuf));
        if (nb>0) {
          if (caller_is_mcpl_repair) {
            *repair_status = 1;//file broken but can't recover since gzip.
          } else {
            mcpl_error("Input file appears to not have been closed properly"
                       " and data recovery is disabled for gzipped files.");
          }
        }
      } else {
        if (!caller_is_mcpl_repair)
          mcpl_error("logic error (!caller_is_mcpl_repair)");
        *repair_status = 2;//file brokenness can not be determined since gzip.
      }
      if (!mcpl_gzseek( f->filegz, f->first_particle_pos ) )
        mcpl_error("Unexpected issue skipping to start of empty gzipped file");
    } else {
      //SEEK_END is not guaranteed to always work, so we fail our recovery
      //attempt silently:
      if (f->file && !MCPL_FSEEK_END( f->file )) {
        int64_t endpos = MCPL_FTELL(f->file);
        if (endpos > (int64_t)f->first_particle_pos && (uint64_t)endpos != f->first_particle_pos) {
          uint64_t np = ( endpos - f->first_particle_pos ) / f->particle_size;
          if ( f->nparticles != np ) {
            if ( f->nparticles > 0 && np > f->nparticles ) {
              //should really not happen unless file was corrupted or file was
              //first closed properly and then something was appended to it.
              mcpl_error("Input file has invalid combination of meta-data & filesize.");
            }
            if (caller_is_mcpl_repair) {
              *repair_status = 3;//file broken and should be able to repair
            } else {
              if (f->nparticles!=0)
                mcpl_error("unexpected nparticles value");
              printf("MCPL WARNING: Input file appears to not have been"
                     " closed properly. Recovered %" PRIu64 " particles.\n",np);
            }
            f->nparticles = np;
          }
        }
      }
      MCPL_FSEEK( f->file, f->first_particle_pos );//if this fseek failed, it
                                                   //might just be that we are
                                                   //at EOF with no particles.
    }
  }

  out.internal = f;
  return out;
}